

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_Empty_Test<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_Empty_Test
          (HashtableAllTest_Empty_Test<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  (this->
  super_HashtableAllTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__HashtableTest_00c183b8;
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::~BaseHashtableInterface
            (&(this->
              super_HashtableAllTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
            );
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Empty) {
  EXPECT_TRUE(this->ht_.empty());

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());

  this->ht_.clear();
  EXPECT_TRUE(this->ht_.empty());

  TypeParam empty_ht;
  this->ht_.insert(this->UniqueObject(1));
  this->ht_.swap(empty_ht);
  EXPECT_TRUE(this->ht_.empty());
}